

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O1

void __thiscall sing::HttpResponse::reset(HttpResponse *this)

{
  if (this->mmFile != (char *)0x0) {
    munmap(this->mmFile,(this->mmFileStat).st_size);
    this->mmFile = (char *)0x0;
  }
  memset(&this->mmFileStat,0,0x90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->headers)._M_t);
  this->code = Unknown;
  (this->statusMessage)._M_string_length = 0;
  *(this->statusMessage)._M_dataplus._M_p = '\0';
  (this->body)._M_string_length = 0;
  *(this->body)._M_dataplus._M_p = '\0';
  (this->srcDir)._M_string_length = 0;
  *(this->srcDir)._M_dataplus._M_p = '\0';
  (this->path)._M_string_length = 0;
  *(this->path)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void HttpResponse::reset(){
    unmapFile();
    mmFileStat = {0};
    headers.clear();
    code = Unknown;
    statusMessage.clear();
    body.clear();
    srcDir.clear();
    path.clear();
}